

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O1

void __thiscall
wabt::LexerSourceLineFinder::LexerSourceLineFinder
          (LexerSourceLineFinder *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  pointer *__ptr;
  int local_28 [2];
  
  (this->source_)._M_t.
  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl =
       (source->_M_t).
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (source->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  (this->line_ranges_).
  super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->next_line_start_ = 0;
  (this->line_ranges_).
  super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->line_ranges_).
  super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->last_cr_ = false;
  this->eof_ = false;
  _Var1._M_head_impl =
       (this->source_)._M_t.
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_LexerSource[6])(_Var1._M_head_impl,0);
  local_28[0] = 0;
  local_28[1] = 0;
  std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
  emplace_back<int,int>
            ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
             &this->line_ranges_,local_28,local_28 + 1);
  return;
}

Assistant:

LexerSourceLineFinder::LexerSourceLineFinder(
    std::unique_ptr<LexerSource> source)
    : source_(std::move(source)),
      next_line_start_(0),
      last_cr_(false),
      eof_(false) {
  source_->Seek(0);
  // Line 0 should not be used; but it makes indexing simpler.
  line_ranges_.emplace_back(0, 0);
}